

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DisableIffSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DisableIffSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,ExpressionSyntax *args_3,
          Token *args_4)

{
  Token disable;
  Token iff;
  Token openParen;
  Token closeParen;
  DisableIffSyntax *this_00;
  Token *args_local_4;
  ExpressionSyntax *args_local_3;
  Token *args_local_2;
  Token *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (DisableIffSyntax *)allocate(this,0x58,8);
  disable.kind = args->kind;
  disable._2_1_ = args->field_0x2;
  disable.numFlags.raw = (args->numFlags).raw;
  disable.rawLen = args->rawLen;
  disable.info = args->info;
  iff.kind = args_1->kind;
  iff._2_1_ = args_1->field_0x2;
  iff.numFlags.raw = (args_1->numFlags).raw;
  iff.rawLen = args_1->rawLen;
  iff.info = args_1->info;
  openParen.kind = args_2->kind;
  openParen._2_1_ = args_2->field_0x2;
  openParen.numFlags.raw = (args_2->numFlags).raw;
  openParen.rawLen = args_2->rawLen;
  openParen.info = args_2->info;
  closeParen.kind = args_4->kind;
  closeParen._2_1_ = args_4->field_0x2;
  closeParen.numFlags.raw = (args_4->numFlags).raw;
  closeParen.rawLen = args_4->rawLen;
  closeParen.info = args_4->info;
  slang::syntax::DisableIffSyntax::DisableIffSyntax(this_00,disable,iff,openParen,args_3,closeParen)
  ;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }